

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O3

char * GPU_GetMatrixString(float *A)

{
  char *__s;
  
  GPU_GetMatrixString::flip = GPU_GetMatrixString::flip == '\0';
  __s = GPU_GetMatrixString::buffer;
  if ((bool)GPU_GetMatrixString::flip) {
    __s = GPU_GetMatrixString::buffer2;
  }
  snprintf(__s,0x200,
           "%.1f %.1f %.1f %.1f\n%.1f %.1f %.1f %.1f\n%.1f %.1f %.1f %.1f\n%.1f %.1f %.1f %.1f",
           (double)*A,(double)A[1],(double)A[2],(double)A[3],(double)A[4],(double)A[5],(double)A[6],
           (double)A[7]);
  return __s;
}

Assistant:

const char* GPU_GetMatrixString(const float* A)
{
    static char buffer[512];
    static char buffer2[512];
    static char flip = 0;
    
    char* b = (flip? buffer : buffer2);
    flip = !flip;
    
    snprintf(b, 512, "%.1f %.1f %.1f %.1f\n"
                          "%.1f %.1f %.1f %.1f\n"
                          "%.1f %.1f %.1f %.1f\n"
                          "%.1f %.1f %.1f %.1f", 
                          A[0], A[1], A[2], A[3], 
                          A[4], A[5], A[6], A[7], 
                          A[8], A[9], A[10], A[11], 
                          A[12], A[13], A[14], A[15]);
    return b;
}